

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

uint32 __thiscall rw::Geometry::streamGetSize(Geometry *this)

{
  uint32 uVar1;
  uint32 uVar2;
  int iVar3;
  
  uVar1 = geoStructSize(this);
  uVar2 = MaterialList::streamGetSize(&this->matList);
  iVar3 = PluginList::streamGetSize((PluginList *)&s_plglist,this);
  return iVar3 + uVar2 + uVar1 + 0x24;
}

Assistant:

uint32
Geometry::streamGetSize(void)
{
	uint32 size = 0;
	size += 12 + geoStructSize(this);
	size += 12 + this->matList.streamGetSize();
	size += 12 + s_plglist.streamGetSize(this);
	return size;
}